

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  CacheEntryMap *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  const_iterator cVar12;
  long *plVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  undefined7 in_register_00000011;
  undefined1 uVar16;
  _Alloc_hider __s;
  char *pcVar17;
  cmCacheManager *pcVar18;
  ulong uVar19;
  long lVar20;
  string helpString;
  CacheEntry e;
  string entryKey;
  string cacheFile;
  string buffer;
  ostringstream error;
  ifstream fin;
  ulong *local_5d8;
  char *local_5d0;
  ulong local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  allocator local_5b1;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0;
  undefined4 uStack_598;
  undefined4 uStack_594;
  cmCacheManager *local_590;
  uint local_584;
  ulong *local_580;
  long local_578;
  ulong local_570;
  undefined4 uStack_568;
  undefined4 uStack_564;
  CacheEntry local_560;
  string local_500;
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4c0;
  string *local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4b0;
  ulong *local_4a8;
  long local_4a0;
  ulong local_498;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  cmCacheManager *local_488;
  long local_480;
  undefined1 local_478 [16];
  string local_468;
  _Base_ptr local_448;
  size_t local_440;
  undefined1 local_438 [16];
  _Base_ptr local_428;
  _Base_ptr local_420;
  undefined1 local_418 [16];
  undefined1 local_408 [32];
  CacheEntryMap *local_3e8;
  _Base_ptr local_3e0;
  _Base_ptr local_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  string local_3b0 [3];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_488 = (cmCacheManager *)local_478;
  pcVar3 = (path->_M_dataplus)._M_p;
  local_4b0 = &excludes->_M_t;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_488,pcVar3,pcVar3 + path->_M_string_length);
  std::__cxx11::string::append((char *)&local_488);
  if (internal) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&(this->Cache)._M_t);
  }
  pcVar18 = local_488;
  bVar5 = cmsys::SystemTools::FileExists((char *)local_488);
  if (!bVar5) {
    CleanCMakeFiles(pcVar18,path);
    uVar16 = 0;
    goto LAB_0044e101;
  }
  std::ifstream::ifstream(local_238,(char *)local_488,_S_in);
  bVar5 = (abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0;
  uVar7 = CONCAT71((int7)((ulong)&local_488 >> 8),bVar5);
  if (bVar5) {
    local_5b8 = (undefined4)CONCAT71(in_register_00000011,internal);
    local_584 = (uint)uVar7;
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_468._M_string_length = 0;
    local_468.field_2._M_local_buf[0] = '\0';
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    local_500._M_string_length = 0;
    local_500.field_2._M_local_buf[0] = '\0';
    local_590 = this;
    local_4c0 = &includes->_M_t;
    local_4b8 = path;
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      local_3d8 = &(((_Rep_type *)&local_4b0->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
      local_3e0 = &(includes->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_3e8 = &this->Cache;
LAB_0044d3b5:
      local_5d8 = &local_5c8;
      local_5d0 = (char *)0x0;
      local_5c8 = local_5c8 & 0xffffffffffffff00;
      local_560.Value._M_dataplus._M_p = (pointer)&local_560.Value.field_2;
      local_560.Value._M_string_length = 0;
      local_560.Value.field_2._M_local_buf[0] = '\0';
      local_560.Type = UNINITIALIZED;
      local_560.Properties.
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_560.Properties.
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_560.Properties.
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_560.Properties.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header;
      local_560.Properties.
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_560.Initialized = false;
      local_560.Properties.
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_560.Properties.
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_468,(bool *)0x0,-1);
      for (__s._M_p = local_468._M_dataplus._M_p; uVar7 = (ulong)(byte)*__s._M_p, uVar7 < 0x30;
          __s._M_p = __s._M_p + 1) {
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
          if ((0x800000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0044d852;
          if (uVar7 == 0x2f) goto LAB_0044d48f;
          break;
        }
      }
      goto LAB_0044d4f1;
    }
LAB_0044d8b6:
    pcVar18 = local_590;
    local_590->CacheMajorVersion = 0;
    local_590->CacheMinorVersion = 0;
    paVar2 = &local_3b0[0].field_2;
    local_3b0[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b0,"CMAKE_CACHE_MAJOR_VERSION","");
    this_00 = &pcVar18->Cache;
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             ::find(&this_00->_M_t,local_3b0);
    uVar4 = local_5b8;
    p_Var1 = &(pcVar18->Cache)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)cVar12._M_node == p_Var1) ||
       (*(char *)&cVar12._M_node[4]._M_right != '\x01')) {
      lVar20 = 0;
    }
    else {
      lVar20 = *(long *)(cVar12._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
    }
    if (lVar20 == 0) {
      local_3b0[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b0,"CMAKE_CACHE_MINOR_VERSION","");
      AddCacheEntry(pcVar18,local_3b0,"0",
                    "Minor version of cmake used to create the current loaded cache",INTERNAL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_3b0[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b0,"CMAKE_CACHE_MAJOR_VERSION","");
      AddCacheEntry(pcVar18,local_3b0,"0",
                    "Major version of cmake used to create the current loaded cache",INTERNAL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      local_560.Value._M_dataplus._M_p = local_560.Value._M_dataplus._M_p & 0xffffffff00000000;
      iVar6 = __isoc99_sscanf(lVar20,"%u");
      if (iVar6 == 1) {
        pcVar18->CacheMajorVersion = (uint)local_560.Value._M_dataplus._M_p;
      }
      local_3b0[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b0,"CMAKE_CACHE_MINOR_VERSION","");
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::find(&this_00->_M_t,local_3b0);
      if (((_Rb_tree_header *)cVar12._M_node == p_Var1) ||
         (*(char *)&cVar12._M_node[4]._M_right != '\x01')) {
        lVar20 = 0;
      }
      else {
        lVar20 = *(long *)(cVar12._M_node + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (lVar20 != 0) {
        iVar6 = __isoc99_sscanf(lVar20,"%u",&local_560);
        if (iVar6 == 1) {
          pcVar18->CacheMinorVersion = (uint)local_560.Value._M_dataplus._M_p;
        }
      }
    }
    local_3b0[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"CMAKE_CACHEFILE_DIR","");
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             ::find(&this_00->_M_t,local_3b0);
    if (((_Rb_tree_header *)cVar12._M_node == p_Var1) ||
       (*(char *)&cVar12._M_node[4]._M_right != '\x01')) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = *(char **)(cVar12._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
    }
    if ((char)uVar4 == '\x01' && pcVar17 != (char *)0x0) {
      pcVar3 = (local_4b8->_M_dataplus)._M_p;
      local_3b0[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3b0,pcVar3,pcVar3 + local_4b8->_M_string_length);
      local_560.Value._M_dataplus._M_p = (pointer)&local_560.Value.field_2;
      sVar8 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,pcVar17,pcVar17 + sVar8);
      cmsys::SystemTools::ConvertToUnixSlashes(local_3b0);
      std::__cxx11::string::append((char *)local_3b0);
      std::__cxx11::string::append((char *)&local_560);
      bVar5 = cmsys::SystemTools::SameFile(&local_560.Value,local_3b0);
      if (!bVar5) {
        local_3d0[0] = local_3c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d0,"The current CMakeCache.txt directory ","");
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_3d0,(ulong)local_3b0[0]._M_dataplus._M_p);
        puVar15 = (ulong *)(plVar13 + 2);
        if ((ulong *)*plVar13 == puVar15) {
          local_498 = *puVar15;
          uStack_490 = (undefined4)plVar13[3];
          uStack_48c = *(undefined4 *)((long)plVar13 + 0x1c);
          local_4a8 = &local_498;
        }
        else {
          local_498 = *puVar15;
          local_4a8 = (ulong *)*plVar13;
        }
        local_4a0 = plVar13[1];
        *plVar13 = (long)puVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_4e0 = local_4d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4e0," is different than the directory ","");
        uVar7 = 0xf;
        if (local_4a8 != &local_498) {
          uVar7 = local_498;
        }
        if (uVar7 < (ulong)(local_4d8 + local_4a0)) {
          uVar7 = 0xf;
          if (local_4e0 != local_4d0) {
            uVar7 = local_4d0[0];
          }
          if (uVar7 < (ulong)(local_4d8 + local_4a0)) goto LAB_0044dcf1;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_4a8);
        }
        else {
LAB_0044dcf1:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4a8,(ulong)local_4e0);
        }
        local_580 = &local_570;
        puVar15 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar15) {
          local_570 = *puVar15;
          uStack_568 = *(undefined4 *)(puVar14 + 3);
          uStack_564 = *(undefined4 *)((long)puVar14 + 0x1c);
        }
        else {
          local_570 = *puVar15;
          local_580 = (ulong *)*puVar14;
        }
        local_578 = puVar14[1];
        *puVar14 = puVar15;
        puVar14[1] = 0;
        *(undefined1 *)puVar15 = 0;
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_418 + 0x10),"CMAKE_CACHEFILE_DIR","");
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                 ::find(&this_00->_M_t,(key_type *)(local_418 + 0x10));
        if (((_Rb_tree_header *)cVar12._M_node == p_Var1) ||
           (*(char *)&cVar12._M_node[4]._M_right != '\x01')) {
          pcVar17 = (char *)0x0;
        }
        else {
          pcVar17 = *(char **)(cVar12._M_node + 2);
        }
        std::__cxx11::string::string((string *)&local_428,pcVar17,&local_5b1);
        uVar7 = (long)&local_420->_M_color + local_578;
        uVar19 = 0xf;
        if (local_580 != &local_570) {
          uVar19 = local_570;
        }
        if (uVar19 < uVar7) {
          uVar19 = 0xf;
          if (local_428 != (_Base_ptr)local_418) {
            uVar19 = local_418._0_8_;
          }
          if (uVar19 < uVar7) goto LAB_0044de0b;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,(ulong)local_580);
        }
        else {
LAB_0044de0b:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_580,(ulong)local_428);
        }
        local_5b0 = &local_5a0;
        puVar15 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar15) {
          local_5a0 = *puVar15;
          uStack_598 = *(undefined4 *)(puVar14 + 3);
          uStack_594 = *(undefined4 *)((long)puVar14 + 0x1c);
        }
        else {
          local_5a0 = *puVar15;
          local_5b0 = (ulong *)*puVar14;
        }
        local_5a8 = puVar14[1];
        *puVar14 = puVar15;
        puVar14[1] = 0;
        *(undefined1 *)puVar15 = 0;
        local_448 = (_Base_ptr)local_438;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_448,
                   " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                   ,"");
        uVar7 = 0xf;
        if (local_5b0 != &local_5a0) {
          uVar7 = local_5a0;
        }
        if (uVar7 < local_440 + local_5a8) {
          uVar7 = 0xf;
          if (local_448 != (_Base_ptr)local_438) {
            uVar7 = local_438._0_8_;
          }
          if (uVar7 < local_440 + local_5a8) goto LAB_0044dee2;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,(ulong)local_5b0);
        }
        else {
LAB_0044dee2:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_448);
        }
        local_5d8 = &local_5c8;
        puVar15 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar15) {
          local_5c8 = *puVar15;
          uStack_5c0 = puVar14[3];
        }
        else {
          local_5c8 = *puVar15;
          local_5d8 = (ulong *)*puVar14;
        }
        local_5d0 = (char *)puVar14[1];
        *puVar14 = puVar15;
        puVar14[1] = 0;
        *(undefined1 *)puVar15 = 0;
        if (local_448 != (_Base_ptr)local_438) {
          operator_delete(local_448,local_438._0_8_ + 1);
        }
        if (local_5b0 != &local_5a0) {
          operator_delete(local_5b0,local_5a0 + 1);
        }
        if (local_428 != (_Base_ptr)local_418) {
          operator_delete(local_428,local_418._0_8_ + 1);
        }
        if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        if (local_4e0 != local_4d0) {
          operator_delete(local_4e0,local_4d0[0] + 1);
        }
        if (local_4a8 != &local_498) {
          operator_delete(local_4a8,local_498 + 1);
        }
        if (local_3d0[0] != local_3c0) {
          operator_delete(local_3d0[0],local_3c0[0] + 1);
        }
        cmSystemTools::Error((char *)local_5d8,(char *)0x0,(char *)0x0,(char *)0x0);
        if (local_5d8 != &local_5c8) {
          operator_delete(local_5d8,local_5c8 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.Value._M_dataplus._M_p != &local_560.Value.field_2) {
        operator_delete(local_560.Value._M_dataplus._M_p,
                        CONCAT71(local_560.Value.field_2._M_allocated_capacity._1_7_,
                                 local_560.Value.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,
                      CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                               local_500.field_2._M_local_buf[0]) + 1);
    }
    uVar7 = (ulong)local_584;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,
                      CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                               local_468.field_2._M_local_buf[0]) + 1);
    }
  }
  uVar16 = (undefined1)uVar7;
  std::ifstream::~ifstream(local_238);
LAB_0044e101:
  if (local_488 != (cmCacheManager *)local_478) {
    operator_delete(local_488,local_478._0_8_ + 1);
  }
  return (bool)uVar16;
  while( true ) {
    if ((__s._M_p[2] == 0x5c) && (__s._M_p[3] == 0x6e)) {
      std::__cxx11::string::append((char *)&local_5d8);
    }
    std::__cxx11::string::append((char *)&local_5d8);
    cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_468,(bool *)0x0,-1);
    __s._M_p = local_468._M_dataplus._M_p;
    if (*local_468._M_dataplus._M_p != 0x2f) break;
LAB_0044d48f:
    if (__s._M_p[1] != 0x2f) break;
  }
LAB_0044d4f1:
  local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"HELPSTRING","");
  CacheEntry::SetProperty(&local_560,local_3b0,(char *)local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
  sVar8 = strlen(__s._M_p);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,__s._M_p,__s._M_p + sVar8);
  bVar5 = cmState::ParseCacheEntry(local_3b0,&local_500,&local_560.Value,&local_560.Type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(local_4b0,&local_500);
    if (iVar9._M_node == local_3d8) {
      if (((char)local_5b8 == '\0') && (local_560.Type == INTERNAL)) {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(local_4c0,&local_500);
        if (iVar9._M_node == local_3e0) goto LAB_0044d852;
      }
      if ((char)local_5b8 == '\0') {
        local_560.Type = INTERNAL;
        std::__cxx11::string::_M_replace((ulong)&local_5d8,0,local_5d0,0x651d5d);
        std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_500._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_5d8);
        std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)(local_4b8->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_5d8);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"HELPSTRING","");
        CacheEntry::SetProperty(&local_560,local_3b0,(char *)local_5d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p,
                          local_3b0[0].field_2._M_allocated_capacity + 1);
        }
      }
      bVar5 = ReadPropertyEntry(local_590,&local_500,&local_560);
      if (!bVar5) {
        local_560.Initialized = true;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                  ::operator[](local_3e8,&local_500);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        pmVar10->Type = local_560.Type;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                     *)&pmVar10->Properties,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                     *)&local_560.Properties);
        pmVar10->Initialized = local_560.Initialized;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Parse error in cache file ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,(char *)local_488,local_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0," on line ",9);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,". Offending entry: ",0x13);
    sVar8 = strlen(__s._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s._M_p,sVar8);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_5b0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_5b0 != &local_5a0) {
      operator_delete(local_5b0,local_5a0 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
  }
LAB_0044d852:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               *)&local_560.Properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.Value._M_dataplus._M_p != &local_560.Value.field_2) {
    operator_delete(local_560.Value._M_dataplus._M_p,
                    CONCAT71(local_560.Value.field_2._M_allocated_capacity._1_7_,
                             local_560.Value.field_2._M_local_buf[0]) + 1);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,local_5c8 + 1);
  }
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_0044d8b6;
  goto LAB_0044d3b5;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile.c_str())) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += "\n";
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
                          "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt";
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile;
      error << " on line " << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str().c_str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (const char* cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor, "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (const char* cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor, "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  const char* oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      std::string message =
        std::string("The current CMakeCache.txt directory ") + currentcwd +
        std::string(" is different than the directory ") +
        std::string(this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) +
        std::string(" where CMakeCache.txt was created. This may result "
                    "in binaries being created in the wrong place. If you "
                    "are not sure, reedit the CMakeCache.txt");
      cmSystemTools::Error(message.c_str());
    }
  }
  return true;
}